

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::costEvaluation
          (L2NormCost *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  L2NormCostImplementation *pLVar1;
  bool bVar2;
  double controlCost;
  double stateCost;
  allocator<char> local_69;
  double local_68;
  double local_60;
  double local_58;
  string local_50;
  
  local_58 = 0.0;
  local_60 = 0.0;
  pLVar1 = this->m_pimpl;
  local_68 = time;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"state",&local_69);
  bVar2 = CostAttributes::evaluateCost(&pLVar1->stateCost,local_68,state,&local_58,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    pLVar1 = this->m_pimpl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"control",&local_69);
    bVar2 = CostAttributes::evaluateCost(&pLVar1->controlCost,local_68,control,&local_60,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      *costValue = local_58 + local_60;
      return true;
    }
  }
  return false;
}

Assistant:

bool L2NormCost::costEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, double &costValue)
        {
            double stateCost = 0, controlCost = 0;

            if (!m_pimpl->stateCost.evaluateCost(time, state, stateCost, "state"))
                return false;

            if (!m_pimpl->controlCost.evaluateCost(time, control, controlCost, "control"))
                return false;

            costValue = stateCost + controlCost;

            return true;
        }